

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

void write_unknown_chunks(png_structrp png_ptr,png_const_inforp info_ptr,uint where)

{
  int iVar1;
  size_t length;
  png_unknown_chunkp ppVar2;
  png_unknown_chunkp chunk_name;
  
  if ((long)info_ptr->unknown_chunks_num != 0) {
    chunk_name = info_ptr->unknown_chunks;
    ppVar2 = chunk_name + info_ptr->unknown_chunks_num;
    for (; chunk_name < ppVar2; chunk_name = chunk_name + 1) {
      if ((chunk_name->location & where) != 0) {
        iVar1 = png_handle_as_unknown(png_ptr,chunk_name->name);
        if ((iVar1 != 1) &&
           (((iVar1 == 3 || ((chunk_name->name[3] & 0x20) != 0)) ||
            ((iVar1 == 0 && (png_ptr->unknown_default == 3)))))) {
          length = chunk_name->size;
          if (length == 0) {
            png_warning(png_ptr,"Writing zero-length unknown chunk");
            length = chunk_name->size;
          }
          png_write_chunk(png_ptr,chunk_name->name,chunk_name->data,length);
        }
      }
    }
  }
  return;
}

Assistant:

static void
write_unknown_chunks(png_structrp png_ptr, png_const_inforp info_ptr,
    unsigned int where)
{
   if (info_ptr->unknown_chunks_num != 0)
   {
      png_const_unknown_chunkp up;

      png_debug(5, "writing extra chunks");

      for (up = info_ptr->unknown_chunks;
           up < info_ptr->unknown_chunks + info_ptr->unknown_chunks_num;
           ++up)
         if ((up->location & where) != 0)
      {
         /* If per-chunk unknown chunk handling is enabled use it, otherwise
          * just write the chunks the application has set.
          */
#ifdef PNG_SET_UNKNOWN_CHUNKS_SUPPORTED
         int keep = png_handle_as_unknown(png_ptr, up->name);

         /* NOTE: this code is radically different from the read side in the
          * matter of handling an ancillary unknown chunk.  In the read side
          * the default behavior is to discard it, in the code below the default
          * behavior is to write it.  Critical chunks are, however, only
          * written if explicitly listed or if the default is set to write all
          * unknown chunks.
          *
          * The default handling is also slightly weird - it is not possible to
          * stop the writing of all unsafe-to-copy chunks!
          *
          * TODO: REVIEW: this would seem to be a bug.
          */
         if (keep != PNG_HANDLE_CHUNK_NEVER &&
             ((up->name[3] & 0x20) /* safe-to-copy overrides everything */ ||
              keep == PNG_HANDLE_CHUNK_ALWAYS ||
              (keep == PNG_HANDLE_CHUNK_AS_DEFAULT &&
               png_ptr->unknown_default == PNG_HANDLE_CHUNK_ALWAYS)))
#endif
         {
            /* TODO: review, what is wrong with a zero length unknown chunk? */
            if (up->size == 0)
               png_warning(png_ptr, "Writing zero-length unknown chunk");

            png_write_chunk(png_ptr, up->name, up->data, up->size);
         }
      }
   }
}